

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O0

int __thiscall
re2::Regexp::Walker<int>::WalkInternal(Walker<int> *this,Regexp *re,int top_arg,bool use_copy)

{
  undefined1 auVar1 [16];
  int iVar2;
  ostream *poVar3;
  ulong uVar4;
  int *piVar5;
  Regexp **ppRVar6;
  size_type sVar7;
  byte in_CL;
  int in_EDX;
  Regexp *in_RSI;
  long *in_RDI;
  Regexp **sub;
  bool stop;
  Regexp *re_1;
  int t;
  WalkState<int> *s;
  value_type *in_stack_fffffffffffffdb8;
  stack<re2::WalkState<int>,_std::deque<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>_>
  *in_stack_fffffffffffffdc0;
  LogMessage *in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffdf4;
  char *in_stack_fffffffffffffdf8;
  LogMessage *in_stack_fffffffffffffe00;
  byte local_1e9;
  Regexp *local_1e8;
  int local_1dc;
  reference local_1d8;
  WalkState<int> local_1d0 [9];
  Walker<int> *in_stack_ffffffffffffff60;
  
  Reset(in_stack_ffffffffffffff60);
  if (in_RSI == (Regexp *)0x0) {
    LogMessage::LogMessage
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4);
    poVar3 = LogMessage::stream((LogMessage *)((long)(local_1d0 + 1) + 0x10));
    std::operator<<(poVar3,"Walk NULL");
    LogMessage::~LogMessage(in_stack_fffffffffffffdd0);
    return in_EDX;
  }
  WalkState<int>::WalkState(local_1d0,in_RSI,in_EDX);
  std::
  stack<re2::WalkState<int>,_std::deque<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>_>
  ::push(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  do {
    while( true ) {
      local_1d8 = std::
                  stack<re2::WalkState<int>,_std::deque<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>_>
                  ::top((stack<re2::WalkState<int>,_std::deque<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>_>
                         *)0x22da99);
      local_1e8 = local_1d8->re;
      if (local_1d8->n != -1) break;
      iVar2 = *(int *)((long)in_RDI + 0x14) + -1;
      *(int *)((long)in_RDI + 0x14) = iVar2;
      if (iVar2 < 0) {
        *(undefined1 *)(in_RDI + 2) = 1;
        local_1dc = (**(code **)(*in_RDI + 0x28))(in_RDI,local_1e8,local_1d8->parent_arg);
      }
      else {
        local_1e9 = 0;
        iVar2 = (**(code **)(*in_RDI + 0x10))(in_RDI,local_1e8,local_1d8->parent_arg,&local_1e9);
        local_1d8->pre_arg = iVar2;
        if ((local_1e9 & 1) == 0) {
          local_1d8->n = 0;
          local_1d8->child_args = (int *)0x0;
          if (local_1e8->nsub_ == 1) {
            local_1d8->child_args = &local_1d8->child_arg;
          }
          else if (1 < local_1e8->nsub_) {
            auVar1 = ZEXT216(local_1e8->nsub_) * ZEXT816(4);
            uVar4 = auVar1._0_8_;
            if (auVar1._8_8_ != 0) {
              uVar4 = 0xffffffffffffffff;
            }
            piVar5 = (int *)operator_new__(uVar4);
            local_1d8->child_args = piVar5;
          }
          break;
        }
        local_1dc = local_1d8->pre_arg;
      }
LAB_0022dd35:
      std::
      stack<re2::WalkState<int>,_std::deque<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>_>
      ::pop((stack<re2::WalkState<int>,_std::deque<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>_>
             *)0x22dd43);
      sVar7 = std::
              stack<re2::WalkState<int>,_std::deque<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>_>
              ::size((stack<re2::WalkState<int>,_std::deque<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>_>
                      *)0x22dd51);
      if (sVar7 == 0) {
        return local_1dc;
      }
      local_1d8 = std::
                  stack<re2::WalkState<int>,_std::deque<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>_>
                  ::top((stack<re2::WalkState<int>,_std::deque<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>_>
                         *)0x22dd72);
      if (local_1d8->child_args == (int *)0x0) {
        local_1d8->child_arg = local_1dc;
      }
      else {
        local_1d8->child_args[local_1d8->n] = local_1dc;
      }
      local_1d8->n = local_1d8->n + 1;
    }
    if ((local_1e8->nsub_ == 0) ||
       (ppRVar6 = Regexp::sub(local_1e8), (int)(uint)local_1e8->nsub_ <= local_1d8->n)) {
      local_1dc = (**(code **)(*in_RDI + 0x18))
                            (in_RDI,local_1e8,local_1d8->parent_arg,local_1d8->pre_arg,
                             local_1d8->child_args,local_1d8->n);
      if ((1 < local_1e8->nsub_) &&
         (in_stack_fffffffffffffdc0 =
               (stack<re2::WalkState<int>,_std::deque<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>_>
                *)local_1d8->child_args,
         in_stack_fffffffffffffdc0 !=
         (stack<re2::WalkState<int>,_std::deque<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>_>
          *)0x0)) {
        operator_delete__(in_stack_fffffffffffffdc0);
      }
      goto LAB_0022dd35;
    }
    if (((in_CL & 1) == 0) ||
       ((local_1d8->n < 1 || (ppRVar6[local_1d8->n + -1] != ppRVar6[local_1d8->n])))) {
      WalkState<int>::WalkState
                ((WalkState<int> *)&stack0xfffffffffffffde8,ppRVar6[local_1d8->n],local_1d8->pre_arg
                );
      std::
      stack<re2::WalkState<int>,_std::deque<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>_>
      ::push(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    }
    else {
      iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,local_1d8->child_args[local_1d8->n + -1]);
      local_1d8->child_args[local_1d8->n] = iVar2;
      local_1d8->n = local_1d8->n + 1;
    }
  } while( true );
}

Assistant:

T Regexp::Walker<T>::WalkInternal(Regexp* re, T top_arg,
                                                       bool use_copy) {
  Reset();

  if (re == NULL) {
    LOG(DFATAL) << "Walk NULL";
    return top_arg;
  }

  stack_->push(WalkState<T>(re, top_arg));

  WalkState<T>* s;
  for (;;) {
    T t;
    s = &stack_->top();
    Regexp* re = s->re;
    switch (s->n) {
      case -1: {
        if (--max_visits_ < 0) {
          stopped_early_ = true;
          t = ShortVisit(re, s->parent_arg);
          break;
        }
        bool stop = false;
        s->pre_arg = PreVisit(re, s->parent_arg, &stop);
        if (stop) {
          t = s->pre_arg;
          break;
        }
        s->n = 0;
        s->child_args = NULL;
        if (re->nsub_ == 1)
          s->child_args = &s->child_arg;
        else if (re->nsub_ > 1)
          s->child_args = new T[re->nsub_];
        FALLTHROUGH_INTENDED;
      }
      default: {
        if (re->nsub_ > 0) {
          Regexp** sub = re->sub();
          if (s->n < re->nsub_) {
            if (use_copy && s->n > 0 && sub[s->n - 1] == sub[s->n]) {
              s->child_args[s->n] = Copy(s->child_args[s->n - 1]);
              s->n++;
            } else {
              stack_->push(WalkState<T>(sub[s->n], s->pre_arg));
            }
            continue;
          }
        }

        t = PostVisit(re, s->parent_arg, s->pre_arg, s->child_args, s->n);
        if (re->nsub_ > 1)
          delete[] s->child_args;
        break;
      }
    }

    // We've finished stack_->top().
    // Update next guy down.
    stack_->pop();
    if (stack_->size() == 0)
      return t;
    s = &stack_->top();
    if (s->child_args != NULL)
      s->child_args[s->n] = t;
    else
      s->child_arg = t;
    s->n++;
  }
}